

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_data.h
# Opt level: O0

ON_SubDFace * __thiscall ON_SubDLevel::AddFace(ON_SubDLevel *this,ON_SubDFace *face)

{
  ON_SubDFace *face_local;
  ON_SubDLevel *this_local;
  
  if (face == (ON_SubDFace *)0x0) {
    this_local = (ON_SubDLevel *)0x0;
  }
  else {
    if (this->m_face[1] == (ON_SubDFace *)0x0) {
      this->m_face[0] = face;
      face->m_prev_face = (ON_SubDFace *)0x0;
    }
    else {
      this->m_face[1]->m_next_face = face;
      face->m_prev_face = this->m_face[1];
    }
    this->m_face[1] = face;
    face->m_next_face = (ON_SubDFace *)0x0;
    this->m_face_count = this->m_face_count + 1;
    ResetFaceArray(this);
    this_local = (ON_SubDLevel *)face;
  }
  return (ON_SubDFace *)this_local;
}

Assistant:

const ON_SubDFace* AddFace(class ON_SubDFace* face)
  {
    if (nullptr == face)
      return nullptr;
    if (nullptr == m_face[1])
    {
      m_face[0] = face;
      face->m_prev_face = nullptr;
    }
    else
    {
      m_face[1]->m_next_face = face;
      face->m_prev_face = m_face[1];
    }
    m_face[1] = face;
    face->m_next_face = nullptr;
    m_face_count++;
    ResetFaceArray();
    return face;
  }